

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O3

int knownhost_add(LIBSSH2_KNOWNHOSTS *hosts,char *host,char *salt,char *key_type_name,
                 size_t key_type_len,char *key,size_t keylen,char *comment,size_t commentlen,
                 int typemask,libssh2_knownhost **store)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  known_host *entry;
  char *pcVar4;
  long lVar5;
  size_t sVar6;
  LIBSSH2_SESSION *pLVar7;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  size_t local_60;
  size_t local_58;
  size_t local_50;
  libssh2_knownhost **local_48;
  size_t local_40;
  size_t local_38;
  
  local_48 = store;
  local_40 = commentlen;
  local_70 = comment;
  local_38 = keylen;
  local_78 = key;
  local_68 = key_type_name;
  local_50 = key_type_len;
  sVar3 = strlen(host);
  pLVar7 = hosts->session;
  if ((typemask & 0x3c0000U) == 0) {
    pcVar4 = "No key type set";
    iVar2 = -0x22;
LAB_0011561b:
    iVar2 = _libssh2_error(pLVar7,iVar2,pcVar4);
    return iVar2;
  }
  entry = (known_host *)_libssh2_calloc(pLVar7,0x90);
  if (entry == (known_host *)0x0) {
    pLVar7 = hosts->session;
    pcVar4 = "Unable to allocate memory for known host entry";
    iVar2 = -6;
    goto LAB_0011561b;
  }
  entry->typemask = typemask;
  if ((short)typemask == 3) {
LAB_00115579:
    local_58 = sVar3;
    pcVar4 = (char *)(*hosts->session->alloc)(sVar3 + 1,&hosts->session->abstract);
    entry->name = pcVar4;
    if (pcVar4 == (char *)0x0) {
      iVar2 = _libssh2_error(hosts->session,-6,"Unable to allocate memory for host name");
      goto LAB_001158ac;
    }
    memcpy(pcVar4,host,sVar3 + 1);
    lVar5 = 0x20;
    local_60 = local_58;
  }
  else {
    if ((typemask & 0xffffU) != 2) {
      if ((typemask & 0xffffU) != 1) {
        iVar2 = _libssh2_error(hosts->session,-0x21,"Unknown host name type");
        goto LAB_001158ac;
      }
      goto LAB_00115579;
    }
    iVar2 = _libssh2_base64_decode(hosts->session,&local_80,&local_60,host,sVar3);
    if (iVar2 != 0) goto LAB_001158ac;
    if (salt == (char *)0x0) {
      iVar2 = _libssh2_error(hosts->session,-0x22,"Salt is NULL");
      goto LAB_001158ac;
    }
    entry->name = local_80;
    entry->name_len = local_60;
    pLVar7 = hosts->session;
    sVar3 = strlen(salt);
    iVar2 = _libssh2_base64_decode(pLVar7,&local_80,&local_60,salt,sVar3);
    if (iVar2 != 0) goto LAB_001158ac;
    entry->salt = local_80;
    lVar5 = 0x38;
  }
  *(size_t *)((long)&(entry->node).next + lVar5) = local_60;
  if (((uint)typemask >> 0x11 & 1) == 0) {
    sVar6 = _libssh2_base64_encode(hosts->session,local_78,local_38,&local_80);
    if (sVar6 == 0) {
      pLVar7 = hosts->session;
      pcVar4 = "Unable to allocate memory for base64-encoded key";
LAB_00115853:
      iVar2 = _libssh2_error(pLVar7,-6,pcVar4);
      goto LAB_001158ac;
    }
    entry->key = local_80;
  }
  else {
    sVar6 = local_38;
    if (local_38 == 0) {
      sVar6 = strlen(local_78);
    }
    pcVar4 = (char *)(*hosts->session->alloc)(sVar6 + 1,&hosts->session->abstract);
    entry->key = pcVar4;
    if (pcVar4 == (char *)0x0) {
      pLVar7 = hosts->session;
      pcVar4 = "Unable to allocate memory for key";
      goto LAB_00115853;
    }
    memcpy(pcVar4,local_78,sVar6 + 1);
    entry->key[sVar6] = '\0';
  }
  sVar1 = local_40;
  sVar6 = local_50;
  if ((typemask & 0x3c0000U) == 0x3c0000 && local_68 != (char *)0x0) {
    pcVar4 = (char *)(*hosts->session->alloc)(local_50 + 1,&hosts->session->abstract);
    entry->key_type_name = pcVar4;
    if (pcVar4 != (char *)0x0) {
      memcpy(pcVar4,local_68,sVar6);
      entry->key_type_name[sVar6] = '\0';
      entry->key_type_len = sVar6;
      goto LAB_0011573a;
    }
    pLVar7 = hosts->session;
    pcVar4 = "Unable to allocate memory for key type";
  }
  else {
LAB_0011573a:
    if (local_70 == (char *)0x0) {
      entry->comment = (char *)0x0;
LAB_001157fd:
      _libssh2_list_add(&hosts->head,(list_node *)entry);
      if (local_48 != (libssh2_knownhost **)0x0) {
        (entry->external).magic = 0xdeadcafe;
        (entry->external).node = entry;
        iVar2 = entry->typemask;
        if ((short)iVar2 == 1) {
          pcVar4 = entry->name;
        }
        else {
          pcVar4 = (char *)0x0;
        }
        (entry->external).name = pcVar4;
        (entry->external).key = entry->key;
        (entry->external).typemask = iVar2;
        *local_48 = &entry->external;
        return 0;
      }
      return 0;
    }
    pcVar4 = (char *)(*hosts->session->alloc)(sVar1 + 1,&hosts->session->abstract);
    entry->comment = pcVar4;
    if (pcVar4 != (char *)0x0) {
      memcpy(pcVar4,local_70,sVar1 + 1);
      entry->comment[sVar1] = '\0';
      entry->comment_len = sVar1;
      goto LAB_001157fd;
    }
    pLVar7 = hosts->session;
    pcVar4 = "Unable to allocate memory for comment";
  }
  iVar2 = _libssh2_error(pLVar7,-6,pcVar4);
LAB_001158ac:
  free_host(hosts->session,entry);
  return iVar2;
}

Assistant:

static int
knownhost_add(LIBSSH2_KNOWNHOSTS *hosts,
              const char *host, const char *salt,
              const char *key_type_name, size_t key_type_len,
              const char *key, size_t keylen,
              const char *comment, size_t commentlen,
              int typemask, struct libssh2_knownhost **store)
{
    struct known_host *entry;
    size_t hostlen = strlen(host);
    int rc;
    char *ptr;
    size_t ptrlen;

    /* make sure we have a key type set */
    if(!(typemask & LIBSSH2_KNOWNHOST_KEY_MASK))
        return _libssh2_error(hosts->session, LIBSSH2_ERROR_INVAL,
                              "No key type set");

    entry = LIBSSH2_CALLOC(hosts->session, sizeof(struct known_host));
    if(!entry)
        return _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                              "Unable to allocate memory for known host "
                              "entry");

    entry->typemask = typemask;

    switch(entry->typemask  & LIBSSH2_KNOWNHOST_TYPE_MASK) {
    case LIBSSH2_KNOWNHOST_TYPE_PLAIN:
    case LIBSSH2_KNOWNHOST_TYPE_CUSTOM:
        entry->name = LIBSSH2_ALLOC(hosts->session, hostlen + 1);
        if(!entry->name) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for host name");
            goto error;
        }
        memcpy(entry->name, host, hostlen + 1);
        entry->name_len = hostlen;
        break;
    case LIBSSH2_KNOWNHOST_TYPE_SHA1:
        rc = _libssh2_base64_decode(hosts->session, &ptr, &ptrlen,
                                    host, hostlen);
        if(rc)
            goto error;

        if(!salt) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_INVAL,
                                "Salt is NULL");
            goto error;
        }

        entry->name = ptr;
        entry->name_len = ptrlen;

        rc = _libssh2_base64_decode(hosts->session, &ptr, &ptrlen,
                                    salt, strlen(salt));
        if(rc)
            goto error;
        entry->salt = ptr;
        entry->salt_len = ptrlen;
        break;
    default:
        rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                            "Unknown host name type");
        goto error;
    }

    if(typemask & LIBSSH2_KNOWNHOST_KEYENC_BASE64) {
        /* the provided key is base64 encoded already */
        if(!keylen)
            keylen = strlen(key);
        entry->key = LIBSSH2_ALLOC(hosts->session, keylen + 1);
        if(!entry->key) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for key");
            goto error;
        }
        memcpy(entry->key, key, keylen + 1);
        entry->key[keylen] = 0; /* force a terminating zero trailer */
    }
    else {
        /* key is raw, we base64 encode it and store it as such */
        size_t nlen = _libssh2_base64_encode(hosts->session, key, keylen,
                                             &ptr);
        if(!nlen) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for "
                                "base64-encoded key");
            goto error;
        }

        entry->key = ptr;
    }

    if(key_type_name && ((typemask & LIBSSH2_KNOWNHOST_KEY_MASK) ==
                          LIBSSH2_KNOWNHOST_KEY_UNKNOWN)) {
        entry->key_type_name = LIBSSH2_ALLOC(hosts->session, key_type_len + 1);
        if(!entry->key_type_name) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for key type");
            goto error;
        }
        memcpy(entry->key_type_name, key_type_name, key_type_len);
        entry->key_type_name[key_type_len] = 0;
        entry->key_type_len = key_type_len;
    }

    if(comment) {
        entry->comment = LIBSSH2_ALLOC(hosts->session, commentlen + 1);
        if(!entry->comment) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for comment");
            goto error;
        }
        memcpy(entry->comment, comment, commentlen + 1);
        entry->comment[commentlen] = 0; /* force a terminating zero trailer */
        entry->comment_len = commentlen;
    }
    else {
        entry->comment = NULL;
    }

    /* add this new host to the big list of known hosts */
    _libssh2_list_add(&hosts->head, &entry->node);

    if(store)
        *store = knownhost_to_external(entry);

    return LIBSSH2_ERROR_NONE;
error:
    free_host(hosts->session, entry);
    return rc;
}